

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

int FindCollisions<Blob<224>>
              (vector<Blob<224>,_std::allocator<Blob<224>_>_> *hashes,
              HashSet<Blob<224>_> *collisions,int maxCollisions)

{
  pointer pBVar1;
  ulong uVar2;
  pointer pBVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  pBVar3 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar1 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar3 != pBVar1) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pBVar3,pBVar1,
               (int)LZCOUNT(((long)pBVar1 - (long)pBVar3 >> 2) * 0x6db6db6db6db6db7) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Blob<224>*,std::vector<Blob<224>,std::allocator<Blob<224>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pBVar3,pBVar1);
  }
  pBVar3 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar6 = 0;
  if (1 < (ulong)(((long)(hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 2) *
                 0x6db6db6db6db6db7)) {
    uVar7 = 1;
    iVar6 = 0;
    lVar5 = 0x1d;
    do {
      if (pBVar3[uVar7].bytes[0] == pBVar3[uVar7 - 1].bytes[0]) {
        uVar2 = 0;
        do {
          uVar4 = uVar2;
          if (uVar4 == 0x1b) break;
          uVar2 = uVar4 + 1;
        } while (pBVar3->bytes[uVar4 + lVar5] == pBVar3[-1].bytes[uVar4 + lVar5]);
        if (0x1a < uVar4) {
          iVar6 = iVar6 + 1;
          if ((int)(collisions->
                   super_set<Blob<224>,_std::less<Blob<224>_>,_std::allocator<Blob<224>_>_>)._M_t.
                   _M_impl.super__Rb_tree_header._M_node_count < maxCollisions) {
            std::
            _Rb_tree<Blob<224>,Blob<224>,std::_Identity<Blob<224>>,std::less<Blob<224>>,std::allocator<Blob<224>>>
            ::_M_insert_unique<Blob<224>const&>
                      ((_Rb_tree<Blob<224>,Blob<224>,std::_Identity<Blob<224>>,std::less<Blob<224>>,std::allocator<Blob<224>>>
                        *)collisions,pBVar3 + uVar7);
          }
        }
      }
      uVar7 = uVar7 + 1;
      pBVar3 = (hashes->super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x1c;
    } while (uVar7 < (ulong)(((long)(hashes->
                                    super__Vector_base<Blob<224>,_std::allocator<Blob<224>_>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3 >> 2) *
                            0x6db6db6db6db6db7));
  }
  return iVar6;
}

Assistant:

int FindCollisions ( std::vector<hashtype> & hashes,
                     HashSet<hashtype> & collisions,
                     int maxCollisions )
{
  int collcount = 0;

  std::sort(hashes.begin(),hashes.end());

  for(size_t hnb = 1; hnb < hashes.size(); hnb++)
  {
    if(hashes[hnb] == hashes[hnb-1])
    {
      collcount++;

      if((int)collisions.size() < maxCollisions)
      {
        collisions.insert(hashes[hnb]);
      }
    }
  }

  return collcount;
}